

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_socket.c
# Opt level: O1

int skynet_socket_poll(void)

{
  uint uVar1;
  _Bool padding;
  int type;
  int more;
  socket_message result;
  int local_24;
  socket_message local_20;
  
  if (SOCKET_SERVER == (socket_server *)0x0) {
    __assert_fail("ss",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_socket.c"
                  ,0x4c,"int skynet_socket_poll()");
  }
  local_24 = 1;
  uVar1 = socket_server_poll(SOCKET_SERVER,&local_20,&local_24);
  switch(uVar1) {
  case 0:
    type = 1;
    break;
  case 1:
    type = 3;
    break;
  case 2:
    type = 2;
    goto LAB_0010f751;
  case 3:
    type = 4;
    goto LAB_0010f751;
  case 4:
    type = 5;
LAB_0010f751:
    padding = true;
    goto LAB_0010f78d;
  case 5:
    return 0;
  case 6:
    type = 6;
    break;
  default:
    skynet_error((skynet_context *)0x0,"Unknown socket message type %d.",(ulong)uVar1);
    return -1;
  }
  padding = false;
LAB_0010f78d:
  forward_message(type,padding,&local_20);
  return -(uint)(local_24 != 0) | 1;
}

Assistant:

int 
skynet_socket_poll() {
	struct socket_server *ss = SOCKET_SERVER;
	assert(ss);
	struct socket_message result;
	int more = 1;
	int type = socket_server_poll(ss, &result, &more);
	switch (type) {
	case SOCKET_EXIT:
		return 0;
	case SOCKET_DATA:
		forward_message(SKYNET_SOCKET_TYPE_DATA, false, &result);
		break;
	case SOCKET_CLOSE:
		forward_message(SKYNET_SOCKET_TYPE_CLOSE, false, &result);
		break;
	case SOCKET_OPEN:
		forward_message(SKYNET_SOCKET_TYPE_CONNECT, true, &result);
		break;
	case SOCKET_ERROR:
		forward_message(SKYNET_SOCKET_TYPE_ERROR, true, &result);
		break;
	case SOCKET_ACCEPT:
		forward_message(SKYNET_SOCKET_TYPE_ACCEPT, true, &result);
		break;
	case SOCKET_UDP:
		forward_message(SKYNET_SOCKET_TYPE_UDP, false, &result);
		break;
	default:
		skynet_error(NULL, "Unknown socket message type %d.",type);
		return -1;
	}
	if (more) {
		return -1;
	}
	return 1;
}